

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10_create_string.cpp
# Opt level: O2

char * create_by_char(char ch,int size)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  
  iVar2 = -1;
  if (-2 < size) {
    iVar2 = size + 1;
  }
  pcVar1 = (char *)operator_new__((long)iVar2);
  for (lVar3 = 0; lVar3 <= size; lVar3 = lVar3 + 1) {
    cVar4 = '\0';
    if (lVar3 < size) {
      cVar4 = ch;
    }
    pcVar1[lVar3] = cVar4;
  }
  return pcVar1;
}

Assistant:

char * create_by_char(char ch, int size)
{
    //  使用 new 创建指定长度字符串，最后一位填充为 '\0'
    char *str = new char[size + 1];
    for(int i = 0; i <= size; i++) {
        if (i < size) {
            // 每个字符指向的地址
            str[i] = ch;
        } else {
            str[i] = '\0';
        }
    }
    //  返回指针
    return str;
}